

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O2

t_int * scalarmin_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  long lVar3;
  long lVar4;
  t_int tVar5;
  long lVar6;
  float fVar7;
  
  lVar3 = w[1];
  fVar1 = *(float *)w[2];
  lVar4 = w[3];
  tVar5 = w[4];
  for (lVar6 = 0; (int)tVar5 != (int)lVar6; lVar6 = lVar6 + 1) {
    fVar2 = *(float *)(lVar3 + lVar6 * 4);
    fVar7 = fVar1;
    if (fVar2 <= fVar1) {
      fVar7 = fVar2;
    }
    *(float *)(lVar4 + lVar6 * 4) = fVar7;
  }
  return w + 5;
}

Assistant:

t_int *scalarmin_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_float f = *(t_float *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    while (n--)
    {
        t_sample g = *in++;
        *out++ = (f < g ? f : g);
    }
    return (w+5);
}